

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O1

void __thiscall Liby::http::RequestParser::parse(RequestParser *this,char *begin,char *end)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *end_00;
  int iVar4;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  
  pcVar3 = begin;
  pcVar2 = begin;
  switch(this->progress_) {
  case 1:
    local_29 = 0x20;
    pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>(begin,end);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    bVar1 = ParseMethod(this,begin,pcVar2);
    if (!bVar1) {
      return;
    }
    pcVar2 = pcVar2 + 1;
    this->bytes_ = this->bytes_ + ((int)pcVar2 - (int)begin);
    break;
  case 2:
    break;
  case 3:
    goto switchD_0011b321_caseD_3;
  case 4:
    goto switchD_0011b321_caseD_4;
  default:
    goto switchD_0011b321_default;
  }
  local_2a = 0x20;
  pcVar3 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>(pcVar2,end);
  if ((pcVar3 != (char *)0x0) && (bVar1 = ParseURI(this,pcVar2,pcVar3), bVar1)) {
    pcVar3 = pcVar3 + 1;
    this->bytes_ = this->bytes_ + ((int)pcVar3 - (int)pcVar2);
switchD_0011b321_caseD_3:
    local_2b = 10;
    pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>(pcVar3,end);
    if (pcVar2 != (char *)0x0) {
      end_00 = pcVar2 + -1;
      if (pcVar2[-1] != '\r') {
        end_00 = pcVar2;
      }
      bVar1 = ParseHttpVersion(this,pcVar3,end_00);
      if (bVar1) {
        begin = pcVar2 + 1;
        this->bytes_ = this->bytes_ + ((int)begin - (int)pcVar3);
switchD_0011b321_caseD_4:
        if (begin != end) {
          do {
            local_2c = 10;
            pcVar3 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                               (begin,end,&local_2c);
            if (pcVar3 == (char *)0x0) {
              return;
            }
            iVar4 = (int)begin;
            if ((begin == pcVar3) || (begin + 1 == pcVar3)) {
              this->progress_ = 5;
              this->bytes_ = this->bytes_ + ((int)pcVar3 - iVar4) + 1;
              return;
            }
            pcVar2 = pcVar3;
            if (pcVar3[-1] == '\r') {
              pcVar2 = pcVar3 + -1;
            }
            bVar1 = ParseHeader(this,begin,pcVar2);
            if (!bVar1) {
              return;
            }
            begin = pcVar3 + 1;
            this->bytes_ = this->bytes_ + ((int)begin - iVar4);
          } while (begin != end);
        }
      }
    }
  }
switchD_0011b321_default:
  return;
}

Assistant:

void RequestParser::parse(const char *begin, const char *end) {
    bool flag;
    const char *finish = nullptr;
    switch (progress_) {
    default:
    case Good:
        break;
    case ParsingMethod:
        finish = std::find(begin, end, ' ');
        if (finish == nullptr)
            return;
        flag = ParseMethod(begin, finish);
        if (flag == false)
            return;
        bytes_ += ++finish - begin;
        begin = finish;
    case ParsingURI:
        finish = std::find(begin, end, ' ');
        if (finish == nullptr)
            return;
        flag = ParseURI(begin, finish);
        if (flag == false)
            return;
        bytes_ += ++finish - begin;
        begin = finish;
    case ParsingVersion:
        finish = std::find(begin, end, '\n');
        if (finish == nullptr)
            return;
        flag = ParseHttpVersion(begin,
                                *(finish - 1) == '\r' ? finish - 1 : finish);
        if (flag == false)
            return;
        bytes_ += ++finish - begin;
        begin = finish;
    case ParsingHeaders: {
        while (begin != end) {
            finish = std::find(begin, end, '\n');
            if (finish == nullptr)
                return;
            if (begin == finish || begin + 1 == finish) {
                progress_ = Good;
                bytes_ += ++finish - begin;
                return;
            }
            flag =
                ParseHeader(begin, *(finish - 1) == '\r' ? finish - 1 : finish);
            if (flag == false)
                return;
            bytes_ += ++finish - begin;
            begin = finish;
        }
    } break;
    }
}